

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O2

int CfdSetReissueAsset(void *handle,void *create_handle,char *txid,uint32_t vout,
                      int64_t asset_amount,char *blinding_nonce,char *entropy,char *address,
                      char *direct_locking_script,char **asset_string)

{
  ConfidentialTransactionContext *this;
  char *pcVar1;
  CfdException *pCVar2;
  bool is_bitcoin;
  allocator local_4ca;
  allocator local_4c9;
  void *local_4c8;
  string local_4c0;
  IssuanceParameter data;
  string local_430;
  string local_410;
  OutPoint outpoint;
  BlindFactor local_3c8;
  IssuanceOutputParameter issuance_data;
  
  local_4c8 = handle;
  cfd::Initialize();
  std::__cxx11::string::string((string *)&issuance_data,"TransactionData",(allocator *)&data);
  cfd::capi::CheckBuffer(create_handle,(string *)&issuance_data);
  std::__cxx11::string::~string((string *)&issuance_data);
  if (address == (char *)0x0 && direct_locking_script == (char *)0x0) {
    issuance_data.address._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/capi/cfdcapi_elements_transaction.cpp"
         + 0x66;
    issuance_data.address.witness_ver_ = 0xb2c;
    issuance_data.address.address_._M_dataplus._M_p = "CfdSetReissueAsset";
    cfd::core::logger::warn<>
              ((CfdSourceLocation *)&issuance_data,"asset address and script is null.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&issuance_data,"Failed to parameter. asset address and script is null.",
               (allocator *)&data);
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&issuance_data);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (txid == (char *)0x0) {
    issuance_data.address._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/capi/cfdcapi_elements_transaction.cpp"
         + 0x66;
    issuance_data.address.witness_ver_ = 0xb32;
    issuance_data.address.address_._M_dataplus._M_p = "CfdSetReissueAsset";
    cfd::core::logger::warn<>((CfdSourceLocation *)&issuance_data,"txid is null.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&issuance_data,"Failed to parameter. txid is null.",(allocator *)&data);
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&issuance_data);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (blinding_nonce == (char *)0x0) {
    issuance_data.address._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/capi/cfdcapi_elements_transaction.cpp"
         + 0x66;
    issuance_data.address.witness_ver_ = 0xb38;
    issuance_data.address.address_._M_dataplus._M_p = "CfdSetReissueAsset";
    cfd::core::logger::warn<>((CfdSourceLocation *)&issuance_data,"blinding_nonce is null.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&issuance_data,"Failed to parameter. blinding_nonce is null.",
               (allocator *)&data);
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&issuance_data);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (entropy != (char *)0x0) {
    is_bitcoin = false;
    cfd::capi::ConvertNetType(*(int *)((long)create_handle + 0x10),&is_bitcoin);
    this = *(ConfidentialTransactionContext **)((long)create_handle + 0x18);
    if (this == (ConfidentialTransactionContext *)0x0) {
      pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&issuance_data,"Invalid handle state. tx is null",(allocator *)&data);
      cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)&issuance_data);
      __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    if (is_bitcoin != true) {
      std::__cxx11::string::string((string *)&data,txid,(allocator *)&local_4c0);
      cfd::core::Txid::Txid((Txid *)&issuance_data,(string *)&data);
      cfd::core::OutPoint::OutPoint(&outpoint,(Txid *)&issuance_data,vout);
      cfd::core::Txid::~Txid((Txid *)&issuance_data);
      std::__cxx11::string::~string((string *)&data);
      cfd::capi::ConvertToIssuanceParameter(&issuance_data,address,direct_locking_script);
      cfd::core::Amount::Amount((Amount *)&data,asset_amount);
      issuance_data.amount.ignore_check_ =
           (bool)data.entropy.data_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start._0_1_;
      issuance_data.amount.amount_ = (int64_t)data.entropy._vptr_BlindFactor;
      std::__cxx11::string::string((string *)&local_410,blinding_nonce,&local_4c9);
      cfd::core::BlindFactor::BlindFactor((BlindFactor *)&local_4c0,&local_410);
      std::__cxx11::string::string((string *)&local_430,entropy,&local_4ca);
      cfd::core::BlindFactor::BlindFactor(&local_3c8,&local_430);
      cfd::ConfidentialTransactionContext::SetAssetReissuance
                (&data,this,&outpoint,&issuance_data.amount,&issuance_data,(BlindFactor *)&local_4c0
                 ,&local_3c8);
      cfd::core::BlindFactor::~BlindFactor(&local_3c8);
      std::__cxx11::string::~string((string *)&local_430);
      cfd::core::BlindFactor::~BlindFactor((BlindFactor *)&local_4c0);
      std::__cxx11::string::~string((string *)&local_410);
      if (asset_string != (char **)0x0) {
        cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_4c0,&data.asset);
        pcVar1 = cfd::capi::CreateString(&local_4c0);
        *asset_string = pcVar1;
        std::__cxx11::string::~string((string *)&local_4c0);
      }
      cfd::core::IssuanceParameter::~IssuanceParameter(&data);
      cfd::IssuanceOutputParameter::~IssuanceOutputParameter(&issuance_data);
      cfd::core::Txid::~Txid(&outpoint.txid_);
      return 0;
    }
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&issuance_data,"Invalid handle state. tx is bitcoin.",(allocator *)&data);
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)&issuance_data);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  issuance_data.address._0_8_ =
       (long)
       "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/capi/cfdcapi_elements_transaction.cpp"
       + 0x66;
  issuance_data.address.witness_ver_ = 0xb3e;
  issuance_data.address.address_._M_dataplus._M_p = "CfdSetReissueAsset";
  cfd::core::logger::warn<>((CfdSourceLocation *)&issuance_data,"entropy is null.");
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&issuance_data,"Failed to parameter. entropy is null.",(allocator *)&data);
  cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&issuance_data);
  __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdSetReissueAsset(
    void* handle, void* create_handle, const char* txid, uint32_t vout,
    int64_t asset_amount, const char* blinding_nonce, const char* entropy,
    const char* address, const char* direct_locking_script,
    char** asset_string) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(create_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(create_handle);
    if ((address == nullptr) && (direct_locking_script == nullptr)) {
      warn(CFD_LOG_SOURCE, "asset address and script is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. asset address and script is null.");
    }
    if (txid == nullptr) {
      warn(CFD_LOG_SOURCE, "txid is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null.");
    }
    if (blinding_nonce == nullptr) {
      warn(CFD_LOG_SOURCE, "blinding_nonce is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. blinding_nonce is null.");
    }
    if (entropy == nullptr) {
      warn(CFD_LOG_SOURCE, "entropy is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. entropy is null.");
    }

    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Invalid handle state. tx is bitcoin.");
    }

    ConfidentialTransactionContext* tx =
        static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
    OutPoint outpoint(Txid(txid), vout);
    cfd::IssuanceOutputParameter issuance_data =
        ConvertToIssuanceParameter(address, direct_locking_script);
    issuance_data.amount = Amount(asset_amount);

    auto data = tx->SetAssetReissuance(
        outpoint, issuance_data.amount, issuance_data,
        BlindFactor(blinding_nonce), BlindFactor(entropy));

    if (asset_string != nullptr) {
      *asset_string = CreateString(data.asset.GetHex());
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}